

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O0

void __thiscall
t_perl_generator::perl_namespace_dirs
          (t_perl_generator *this,t_program *p,
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *dirs)

{
  undefined8 this_00;
  long lVar1;
  string local_c0 [32];
  value_type local_a0;
  long local_80;
  size_type loc;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  string ns;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *dirs_local;
  t_program *p_local;
  t_perl_generator *this_local;
  
  ns.field_2._8_8_ = dirs;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"perl",&local_61);
  t_program::get_namespace((string *)local_40,p,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  lVar1 = std::__cxx11::string::size();
  if (lVar1 != 0) {
    while (local_80 = std::__cxx11::string::find(local_40,0x4e5538), this_00 = ns.field_2._8_8_,
          local_80 != -1) {
      std::__cxx11::string::substr((ulong)&local_a0,(ulong)local_40);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_00,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::substr((ulong)local_c0,(ulong)local_40);
      std::__cxx11::string::operator=((string *)local_40,local_c0);
      std::__cxx11::string::~string(local_c0);
    }
    local_80 = -1;
  }
  lVar1 = std::__cxx11::string::size();
  if (lVar1 != 0) {
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)ns.field_2._8_8_,(value_type *)local_40);
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void perl_namespace_dirs(t_program* p, std::list<std::string>& dirs) {
    std::string ns = p->get_namespace("perl");
    std::string::size_type loc;

    if (ns.size() > 0) {
      while ((loc = ns.find(".")) != std::string::npos) {
        dirs.push_back(ns.substr(0, loc));
        ns = ns.substr(loc + 1);
      }
    }

    if (ns.size() > 0) {
      dirs.push_back(ns);
    }
  }